

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImage2DArrayBufferCase::createTexture
          (TexSubImage2DArrayBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int iVar1;
  int iVar2;
  TransferFormat TVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  deUint32 buf;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  PixelBufferAccess local_b0;
  Vec4 colorB;
  Vec4 cBias;
  Vec4 cScale;
  Vec4 colorA;
  Vector<float,_4> local_48;
  
  this_01 = &(this->super_Texture2DArraySpecCase).m_texFormat;
  TVar3 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  iVar2 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  uVar4 = (this->super_Texture2DArraySpecCase).m_width * iVar2 + 3U & 0xfffffffc;
  iVar5 = (this->super_Texture2DArraySpecCase).m_height * uVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->super_Texture2DArraySpecCase).m_numLayers * iVar5));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,this_01,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,uVar4,iVar5,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  minVal = &(this->super_Texture2DArraySpecCase).m_texFormatInfo;
  maxVal = &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax;
  tcu::fillWithComponentGradients(&local_b0,&minVal->valueMin,maxVal);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x8c1a,0,this->m_internalFormat,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,0,TVar3.format,TVar3.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar5 = this->m_imageHeight;
  iVar6 = this->m_rowLength;
  if (iVar6 < 1) {
    iVar6 = this->m_subW;
  }
  if (iVar5 < 1) {
    iVar5 = this->m_subH;
  }
  iVar1 = this->m_alignment;
  tcu::operator-((tcu *)&cScale,maxVal,&minVal->valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&minVal->valueMin);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_b0,&colorB,&cScale);
  tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&local_b0,&cBias);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_b0,&local_48,&cScale);
  tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)&local_b0,&cBias);
  uVar4 = -iVar1 & (iVar6 * iVar2 + iVar1) - 1U;
  iVar5 = iVar5 * uVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->m_skipImages + (this->super_Texture2DArraySpecCase).m_numLayers) *
                          iVar5 + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_b0,this_01,this->m_subW,this->m_subH,this->m_subD,uVar4,iVar5,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset +
             (long)(this->m_skipPixels * iVar2) + (long)(int)(this->m_skipRows * uVar4) +
             (long)(this->m_skipImages * iVar5));
  tcu::fillWithGrid(&local_b0,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,this->m_subX,this->m_subY,this->m_subZ,this->m_subW,this->m_subH,
             this->m_subD,TVar3.format,TVar3.dataType,(void *)(long)this->m_offset);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);

		// Fill with gradient.
		{
			int		rowPitch		= deAlign32(pixelSize*m_width,  4);
			int		slicePitch		= rowPitch*m_height;

			data.resize(slicePitch*m_numLayers);
			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_numLayers, rowPitch, slicePitch, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		}

		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_internalFormat, m_width, m_height, m_numLayers, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength		= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
			int		imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_subH;
			int		slicePitch		= imageHeight*rowPitch;
			Vec4	cScale			= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias			= m_texFormatInfo.valueMin;
			Vec4	colorA			= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB			= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(slicePitch*(m_numLayers+m_skipImages) + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, m_subD, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, m_subX, m_subY, m_subZ, m_subW, m_subH, m_subD, transferFmt.format, transferFmt.dataType, (const void*)(deIntptr)m_offset);
	}